

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::SourceCodeInfo_Location::MergeFrom
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  string *psVar6;
  void **our_elems;
  int iVar7;
  Arena *pAVar8;
  
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  iVar7 = (from->path_).current_size_;
  if (iVar7 != 0) {
    iVar1 = (this->path_).current_size_;
    RepeatedField<int>::Reserve(&this->path_,iVar7 + iVar1);
    (this->path_).current_size_ = (this->path_).current_size_ + (from->path_).current_size_;
    memcpy((void *)((long)iVar1 * 4 + (long)(this->path_).arena_or_elements_),
           (from->path_).arena_or_elements_,(long)(from->path_).current_size_ << 2);
  }
  iVar7 = (from->span_).current_size_;
  if (iVar7 != 0) {
    iVar1 = (this->span_).current_size_;
    RepeatedField<int>::Reserve(&this->span_,iVar7 + iVar1);
    (this->span_).current_size_ = (this->span_).current_size_ + (from->span_).current_size_;
    memcpy((void *)((long)iVar1 * 4 + (long)(this->span_).arena_or_elements_),
           (from->span_).arena_or_elements_,(long)(from->span_).current_size_ << 2);
  }
  iVar7 = (from->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar4 = (from->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,iVar7);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,our_elems,
               pRVar4->elements,iVar7,
               ((this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_)->allocated_size
               - (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
    (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar7) {
      pRVar4->allocated_size = iVar7;
    }
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar5 = (from->leading_comments_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar8 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      psVar6 = (this->leading_comments_).ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->leading_comments_,pAVar8,psVar5);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar6);
      }
    }
    if ((uVar2 & 2) != 0) {
      psVar5 = (from->trailing_comments_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar8 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      psVar6 = (this->trailing_comments_).ptr_;
      if (psVar6 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)psVar6);
        return;
      }
      internal::ArenaStringPtr::CreateInstance(&this->trailing_comments_,pAVar8,psVar5);
      return;
    }
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeFrom(const SourceCodeInfo_Location& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  path_.MergeFrom(from.path_);
  span_.MergeFrom(from.span_);
  leading_detached_comments_.MergeFrom(from.leading_detached_comments_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_leading_comments(from._internal_leading_comments());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
}